

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_message.hpp
# Opt level: O0

void __thiscall
Catch::Capturer::captureValues<int,int,char,int,char[4]>
          (Capturer *this,size_t index,int *value,int *values,char *values_1,int *values_2,
          char (*values_3) [4])

{
  string local_58;
  int *local_38;
  int *values_local_2;
  char *values_local_1;
  int *values_local;
  int *value_local;
  size_t index_local;
  Capturer *this_local;
  
  local_38 = values_2;
  values_local_2 = (int *)values_1;
  values_local_1 = (char *)values;
  values_local = value;
  value_local = (int *)index;
  index_local = (size_t)this;
  Detail::stringify<int>(&local_58,value);
  captureValue(this,index,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  captureValues<int,char,int,char[4]>
            (this,(long)value_local + 1,(int *)values_local_1,(char *)values_local_2,local_38,
             values_3);
  return;
}

Assistant:

void captureValues( size_t index, T const& value, Ts const&... values ) {
            captureValue( index, Catch::Detail::stringify(value) );
            captureValues( index+1, values... );
        }